

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O2

void __thiscall Inject::default_impl_override::test_method(default_impl_override *this)

{
  int iVar1;
  service *psVar2;
  undefined4 extraout_var;
  component<Inject::impl2> z;
  component<Inject::impl1> y;
  implemented_by<Inject::impl1,_(inject::component_scope)0> xx;
  component<Inject::service> x;
  injected<Inject::service> actual;
  char *local_f0;
  char *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  unique_id local_c0;
  undefined8 local_b8;
  provides<Inject::service> zz;
  provides<Inject::service> yy;
  char *local_90;
  char *local_88;
  context<0> c;
  
  inject::context<0>::component<Inject::service>::component(&x);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::implemented_by(&xx);
  inject::context<0>::component<Inject::impl1>::component(&y);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&yy);
  inject::context<0>::component<Inject::impl2>::component(&z);
  inject::context<0>::component<Inject::impl2>::provides<Inject::service>::provides(&zz);
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  c._vptr_context = (_func_int **)&PTR__context_0015fda8;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &c._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  c._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &c;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       c._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl2,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::injected<Inject::service>::injected(&actual);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_88 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x13f);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0015fea8;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = "";
  psVar2 = inject::context<0>::injected<Inject::service>::operator->(&actual);
  iVar1 = (**psVar2->_vptr_service)(psVar2);
  local_b8 = CONCAT44(extraout_var,iVar1);
  local_c0 = inject::id_of<Inject::impl2>::id();
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_e0,&local_f0,0x13f,1,2,&local_b8,"actual->id()",&local_c0,"id_of<impl2>::id()");
  boost::detail::shared_count::~shared_count(&actual._ptr.pn);
  inject::context<0>::~context(&c);
  inject::context<0>::component<Inject::impl2>::~component(&z);
  inject::context<0>::component<Inject::impl1>::~component(&y);
  inject::context<0>::component<Inject::service>::
  implemented_by<Inject::impl1,_(inject::component_scope)0>::~implemented_by(&xx);
  inject::context<0>::component<Inject::service>::~component(&x);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(default_impl_override)
{
    context<>::component<service> x;
    context<>::component<service>::implemented_by<impl1> xx;

    context<>::component<impl1> y;
    context<>::component<impl1>::provides<service> yy;
    
    context<>::component<impl2> z;
    context<>::component<impl2>::provides<service> zz;

    context<> c;
    c.bind<service, impl2>();

    context<>::injected<service> actual;
    BOOST_CHECK_EQUAL(actual->id(), id_of<impl2>::id());
}